

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O3

PatternList *
parse_seq(PatternList *__return_storage_ptr__,Tokens *tokens,
         vector<docopt::Option,_std::allocator<docopt::Option>_> *options)

{
  char *pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined1 auVar3 [8];
  pointer psVar4;
  pointer psVar5;
  int iVar6;
  PatternList *pPVar7;
  string *psVar8;
  pointer pcVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  runtime_error *prVar11;
  long lVar12;
  ulong uVar13;
  char *pcVar14;
  size_type *psVar15;
  undefined1 auVar16 [8];
  char *pcVar17;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  _func_int **local_110;
  _func_int **local_108;
  undefined **local_100;
  undefined **local_f8;
  _func_int **local_f0;
  _func_int **local_e8;
  _func_int **local_e0;
  _func_int **local_d8;
  vector<docopt::Option,_std::allocator<docopt::Option>_> *local_d0;
  undefined1 auStack_c8 [8];
  PatternList expr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  undefined1 auStack_98 [8];
  PatternList atom;
  PatternList local_78;
  undefined1 auStack_58 [8];
  string trailing;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar7 = (PatternList *)
           ((long)(tokens->fTokens).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(tokens->fTokens).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5);
  if ((PatternList *)tokens->fIndex < pPVar7) {
    local_110 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00150590;
    local_108 = (_func_int **)&PTR_flat_001505e0;
    local_100 = &PTR___Sp_counted_ptr_inplace_00150888;
    local_f8 = &PTR_flat_001501d8;
    local_f0 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00150658;
    local_e8 = (_func_int **)&PTR_flat_00150148;
    local_e0 = (_func_int **)&PTR___Sp_counted_ptr_inplace_001506a8;
    local_d8 = (_func_int **)&PTR_flat_001506f8;
    local_d0 = options;
    do {
      psVar15 = &trailing._M_string_length;
      psVar8 = Tokens::current_abi_cxx11_(tokens);
      pPVar7 = (PatternList *)std::__cxx11::string::compare((char *)psVar8);
      if ((int)pPVar7 == 0) {
        return pPVar7;
      }
      pPVar7 = (PatternList *)std::__cxx11::string::compare((char *)psVar8);
      if ((int)pPVar7 == 0) {
        return pPVar7;
      }
      pPVar7 = (PatternList *)std::__cxx11::string::compare((char *)psVar8);
      if ((int)pPVar7 == 0) {
        return pPVar7;
      }
      psVar8 = Tokens::current_abi_cxx11_(tokens);
      auStack_98 = (undefined1  [8])0x0;
      atom.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      atom.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      iVar6 = std::__cxx11::string::compare((char *)psVar8);
      if (iVar6 == 0) {
        Tokens::pop_abi_cxx11_(&local_138,tokens);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        parse_expr((PatternList *)auStack_c8,tokens,local_d0);
        Tokens::pop_abi_cxx11_((string *)auStack_58,tokens);
        iVar6 = std::__cxx11::string::compare((char *)auStack_58);
        if (iVar6 != 0) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar11,"Mismatched \'[\'");
          *(undefined ***)prVar11 = &PTR__runtime_error_00150928;
          __cxa_throw(prVar11,&docopt::DocoptLanguageError::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        expr.
        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
        psVar5 = expr.
                 super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        psVar4 = expr.
                 super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        auVar16 = auStack_c8;
        local_a8->_M_use_count = 1;
        local_a8->_M_weak_count = 1;
        local_a8->_vptr__Sp_counted_base = local_110;
        expr.
        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        auStack_c8 = (undefined1  [8])0x0;
        auVar3 = auStack_c8;
        expr.
        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        auStack_c8._0_4_ = auVar16._0_4_;
        auStack_c8._4_4_ = auVar16._4_4_;
        local_a8[1]._M_use_count = auStack_c8._0_4_;
        local_a8[1]._M_weak_count = auStack_c8._4_4_;
        local_a8[2]._vptr__Sp_counted_base = (_func_int **)psVar4;
        *(pointer *)&local_a8[2]._M_use_count = psVar5;
        local_78.
        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_78.
        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.
        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a8[1]._vptr__Sp_counted_base = local_108;
        auStack_c8 = auVar3;
        std::
        vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ::~vector(&local_78);
        expr.
        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(local_a8 + 1);
        std::
        vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>::
        emplace_back<std::shared_ptr<docopt::Optional>>
                  ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                    *)auStack_98,
                   (shared_ptr<docopt::Optional> *)
                   &expr.
                    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_00127e78:
        if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
        }
        if (auStack_58 != (undefined1  [8])psVar15) {
          operator_delete((void *)auStack_58);
        }
        pPVar7 = (PatternList *)auStack_c8;
LAB_00127e9e:
        std::
        vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ::~vector(pPVar7);
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)psVar8);
        if (iVar6 == 0) {
          Tokens::pop_abi_cxx11_(&local_198,tokens);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p);
          }
          parse_expr((PatternList *)auStack_c8,tokens,local_d0);
          Tokens::pop_abi_cxx11_((string *)auStack_58,tokens);
          iVar6 = std::__cxx11::string::compare((char *)auStack_58);
          if (iVar6 != 0) {
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar11,"Mismatched \'(\'");
            *(undefined ***)prVar11 = &PTR__runtime_error_00150928;
            __cxa_throw(prVar11,&docopt::DocoptLanguageError::typeinfo,
                        std::runtime_error::~runtime_error);
          }
          expr.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
          psVar5 = expr.
                   super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          psVar4 = expr.
                   super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          auVar16 = auStack_c8;
          local_a8->_M_use_count = 1;
          local_a8->_M_weak_count = 1;
          local_a8->_vptr__Sp_counted_base = local_f0;
          expr.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          auStack_c8 = (undefined1  [8])0x0;
          auVar3 = auStack_c8;
          expr.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          auStack_c8._0_4_ = auVar16._0_4_;
          auStack_c8._4_4_ = auVar16._4_4_;
          local_a8[1]._M_use_count = auStack_c8._0_4_;
          local_a8[1]._M_weak_count = auStack_c8._4_4_;
          local_a8[2]._vptr__Sp_counted_base = (_func_int **)psVar4;
          *(pointer *)&local_a8[2]._M_use_count = psVar5;
          local_78.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_78.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_78.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_a8[1]._vptr__Sp_counted_base = local_e8;
          auStack_c8 = auVar3;
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::~vector(&local_78);
          expr.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(local_a8 + 1);
          std::
          vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
          ::emplace_back<std::shared_ptr<docopt::Required>>
                    ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                      *)auStack_98,
                     (shared_ptr<docopt::Required> *)
                     &expr.
                      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          goto LAB_00127e78;
        }
        iVar6 = std::__cxx11::string::compare((char *)psVar8);
        if (iVar6 != 0) {
          trailing._M_dataplus._M_p = (pointer)0x2;
          trailing._M_string_length = CONCAT53(trailing._M_string_length._3_5_,0x2d2d);
          if ((psVar8->_M_string_length < 2) || (*(short *)(psVar8->_M_dataplus)._M_p != 0x2d2d)) {
LAB_00127bed:
            trailing._M_string_length = CONCAT62(trailing._M_string_length._2_6_,0x2d);
            trailing._M_dataplus._M_p = (pointer)0x1;
            auStack_58 = (undefined1  [8])psVar15;
            if ((psVar8->_M_string_length != 0) && (*(psVar8->_M_dataplus)._M_p == '-')) {
              iVar6 = std::__cxx11::string::compare((char *)psVar8);
              if (iVar6 == 0) {
                if (auStack_58 != (undefined1  [8])psVar15) {
                  operator_delete((void *)auStack_58);
                }
              }
              else {
                iVar6 = std::__cxx11::string::compare((char *)psVar8);
                if (auStack_58 != (undefined1  [8])psVar15) {
                  operator_delete((void *)auStack_58);
                }
                if (iVar6 != 0) {
                  parse_short(&local_78,tokens,local_d0);
                  goto LAB_001280db;
                }
              }
            }
            uVar13 = psVar8->_M_string_length;
            if (uVar13 == 0) {
LAB_00128241:
              Tokens::pop_abi_cxx11_((string *)auStack_58,tokens);
              local_78.
              super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<docopt::Command,std::allocator<docopt::Command>,std::__cxx11::string>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &local_78.
                          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,(Command **)&local_78,
                         (allocator<docopt::Command> *)auStack_c8,(string *)auStack_58);
              std::
              vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
              ::emplace_back<std::shared_ptr<docopt::Command>>
                        ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                          *)auStack_98,(shared_ptr<docopt::Command> *)&local_78);
            }
            else {
              pcVar17 = (psVar8->_M_dataplus)._M_p;
              if ((*pcVar17 != '<') || (pcVar17[uVar13 - 1] != '>')) {
                pcVar1 = pcVar17 + uVar13;
                pcVar14 = pcVar17;
                if (0 < (long)uVar13 >> 2) {
                  pcVar14 = pcVar17 + (uVar13 & 0xfffffffffffffffc);
                  lVar12 = ((long)uVar13 >> 2) + 1;
                  pcVar17 = pcVar17 + 3;
                  do {
                    iVar6 = isupper((int)pcVar17[-3]);
                    if (iVar6 == 0) {
                      pcVar17 = pcVar17 + -3;
                      goto LAB_0012823c;
                    }
                    iVar6 = isupper((int)pcVar17[-2]);
                    if (iVar6 == 0) {
                      pcVar17 = pcVar17 + -2;
                      goto LAB_0012823c;
                    }
                    iVar6 = isupper((int)pcVar17[-1]);
                    if (iVar6 == 0) {
                      pcVar17 = pcVar17 + -1;
                      goto LAB_0012823c;
                    }
                    iVar6 = isupper((int)*pcVar17);
                    if (iVar6 == 0) goto LAB_0012823c;
                    lVar12 = lVar12 + -1;
                    pcVar17 = pcVar17 + 4;
                  } while (1 < lVar12);
                }
                lVar12 = (long)pcVar1 - (long)pcVar14;
                if (lVar12 == 1) {
LAB_0012822d:
                  iVar6 = isupper((int)*pcVar14);
                  pcVar17 = pcVar14;
                  if (iVar6 != 0) {
                    pcVar17 = pcVar1;
                  }
                }
                else if (lVar12 == 2) {
LAB_00128218:
                  iVar6 = isupper((int)*pcVar14);
                  pcVar17 = pcVar14;
                  if (iVar6 != 0) {
                    pcVar14 = pcVar14 + 1;
                    goto LAB_0012822d;
                  }
                }
                else {
                  if (lVar12 != 3) goto LAB_00128283;
                  iVar6 = isupper((int)*pcVar14);
                  pcVar17 = pcVar14;
                  if (iVar6 != 0) {
                    pcVar14 = pcVar14 + 1;
                    goto LAB_00128218;
                  }
                }
LAB_0012823c:
                if (pcVar17 != pcVar1) goto LAB_00128241;
              }
LAB_00128283:
              Tokens::pop_abi_cxx11_((string *)auStack_58,tokens);
              local_78.
              super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<docopt::Argument,std::allocator<docopt::Argument>,std::__cxx11::string>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &local_78.
                          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,(Argument **)&local_78,
                         (allocator<docopt::Argument> *)auStack_c8,(string *)auStack_58);
              std::
              vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
              ::emplace_back<std::shared_ptr<docopt::Argument>>
                        ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                          *)auStack_98,(shared_ptr<docopt::Argument> *)&local_78);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_78.
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_78.
                         super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            }
            if (auStack_58 != (undefined1  [8])&trailing._M_string_length) {
              operator_delete((void *)auStack_58);
            }
            goto LAB_00127ea3;
          }
          auStack_58 = (undefined1  [8])psVar15;
          iVar6 = std::__cxx11::string::compare((char *)psVar8);
          if (auStack_58 != (undefined1  [8])psVar15) {
            operator_delete((void *)auStack_58);
          }
          if (iVar6 == 0) goto LAB_00127bed;
          parse_long(&local_78,tokens,local_d0);
LAB_001280db:
          trailing._M_string_length =
               (size_type)
               atom.
               super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          pPVar7 = &local_78;
          p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_78.
                    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.
                   super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          atom.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_78.
               super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          auStack_58 = auStack_98;
          trailing._M_dataplus._M_p =
               (pointer)atom.
                        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          local_78.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_78.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_78.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          auStack_98 = (undefined1  [8])p_Var10;
          atom.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var2;
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                     *)auStack_58);
          goto LAB_00127e9e;
        }
        Tokens::pop_abi_cxx11_(&local_178,tokens);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p);
        }
        local_78.
        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
        p_Var10->_M_use_count = 1;
        p_Var10->_M_weak_count = 1;
        p_Var10->_vptr__Sp_counted_base = local_e0;
        p_Var10[2]._M_use_count = 0;
        p_Var10[2]._M_weak_count = 0;
        p_Var10[1]._M_use_count = 0;
        p_Var10[1]._M_weak_count = 0;
        p_Var10[2]._vptr__Sp_counted_base = (_func_int **)0x0;
        trailing._M_string_length = 0;
        auStack_58 = (undefined1  [8])0x0;
        trailing._M_dataplus._M_p = (pointer)0x0;
        std::
        vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   *)auStack_58);
        p_Var10[1]._vptr__Sp_counted_base = local_d8;
        local_78.
        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)(p_Var10 + 1);
        local_78.
        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var10;
        std::
        vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>::
        emplace_back<std::shared_ptr<docopt::OptionsShortcut>>
                  ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                    *)auStack_98,(shared_ptr<docopt::OptionsShortcut> *)&local_78);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_78.
            super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_78.
                     super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
      }
LAB_00127ea3:
      psVar8 = Tokens::current_abi_cxx11_(tokens);
      iVar6 = std::__cxx11::string::compare((char *)psVar8);
      if (iVar6 == 0) {
        auStack_58 = (undefined1  [8])0x0;
        pcVar9 = (pointer)operator_new(0x30);
        psVar5 = atom.
                 super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        psVar4 = atom.
                 super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        auVar16 = auStack_98;
        pcVar9[8] = '\x01';
        pcVar9[9] = '\0';
        pcVar9[10] = '\0';
        pcVar9[0xb] = '\0';
        pcVar9[0xc] = '\x01';
        pcVar9[0xd] = '\0';
        pcVar9[0xe] = '\0';
        pcVar9[0xf] = '\0';
        *(undefined ***)pcVar9 = local_100;
        atom.
        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        auStack_98 = (undefined1  [8])0x0;
        atom.
        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        *(undefined1 (*) [8])(pcVar9 + 0x18) = auVar16;
        *(pointer *)(pcVar9 + 0x20) = psVar4;
        *(pointer *)(pcVar9 + 0x28) = psVar5;
        local_138.field_2._M_allocated_capacity = 0;
        local_138._M_dataplus._M_p = (pointer)0x0;
        local_138._M_string_length = 0;
        *(undefined ***)(pcVar9 + 0x10) = local_f8;
        std::
        vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   *)&local_138);
        auStack_58 = (undefined1  [8])(pcVar9 + 0x10);
        trailing._M_dataplus._M_p = pcVar9;
        std::
        vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>::
        emplace_back<std::shared_ptr<docopt::OneOrMore>>
                  ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                    *)__return_storage_ptr__,(shared_ptr<docopt::OneOrMore> *)auStack_58);
        if (trailing._M_dataplus._M_p != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)trailing._M_dataplus._M_p);
        }
        Tokens::pop_abi_cxx11_(&local_158,tokens);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p);
        }
      }
      else {
        lVar12 = (long)atom.
                       super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                       ._M_impl.super__Vector_impl_data._M_start - (long)auStack_98 >> 4;
        if (0 < lVar12) {
          uVar13 = lVar12 + 1;
          auVar16 = auStack_98;
          do {
            std::
            vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
            ::emplace_back<std::shared_ptr<docopt::Pattern>>
                      ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                        *)__return_storage_ptr__,(shared_ptr<docopt::Pattern> *)auVar16);
            auVar16 = (undefined1  [8])((long)auVar16 + 0x10);
            uVar13 = uVar13 - 1;
          } while (1 < uVar13);
        }
      }
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      ~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               *)auStack_98);
      pPVar7 = (PatternList *)
               ((long)(tokens->fTokens).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(tokens->fTokens).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5);
    } while ((PatternList *)tokens->fIndex < pPVar7);
  }
  return pPVar7;
}

Assistant:

static PatternList parse_seq(Tokens& tokens, std::vector<Option>& options)
{
	// seq ::= ( atom [ '...' ] )* ;"""

	PatternList ret;

	while (tokens) {
		auto const& token = tokens.current();

		if (token=="]" || token==")" || token=="|")
			break;

		auto atom = parse_atom(tokens, options);
		if (tokens.current() == "...") {
			ret.emplace_back(std::make_shared<OneOrMore>(std::move(atom)));
			tokens.pop();
		} else {
			std::move(atom.begin(), atom.end(), std::back_inserter(ret));
		}
	}

	return ret;
}